

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servlk.cpp
# Opt level: O0

void __thiscall icu_63::LocaleKey::~LocaleKey(LocaleKey *this)

{
  void *in_RSI;
  LocaleKey *this_local;
  
  ~LocaleKey(this);
  UMemory::operator_delete((UMemory *)this,in_RSI);
  return;
}

Assistant:

UnicodeString&
LocaleKey::prefix(UnicodeString& result) const {
    if (_kind != KIND_ANY) {
        UChar buffer[64];
        uprv_itou(buffer, 64, _kind, 10, 0);
        UnicodeString temp(buffer);
        result.append(temp);
    }
    return result;
}